

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O3

void sb_bmp_clear(uint8_t *bmp,bid_t bid,uint64_t len)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t front_pos;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar11;
  int iVar12;
  undefined1 auVar9 [16];
  int iVar13;
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM6 [16];
  
  uVar3 = (ulong)((uint)bid & 7);
  uVar4 = 8 - uVar3;
  if (uVar4 < len) {
    uVar6 = (ulong)((uint)(len + bid) & 7);
    uVar1 = uVar4 + bid;
    uVar2 = ((bid | 0xfffffffffffffff8) + len) - uVar6;
    uVar5 = len + bid >> 3;
    len = uVar4;
  }
  else {
    if (len == 0) {
      return;
    }
    uVar2 = 0;
    uVar1 = 0;
    uVar6 = 0;
    uVar5 = 0;
  }
  bmp[bid >> 3] = bmp[bid >> 3] & ~bmp_2d_mask[uVar3][len];
  if (uVar6 != 0) {
    bmp[uVar5] = bmp[uVar5] & ~bmp_2d_mask[0][uVar6];
  }
  if (uVar2 != 8) {
    if (0x3f < uVar2) {
      memset(bmp + (uVar1 >> 3),0,uVar2 >> 3);
      return;
    }
    if (uVar2 == 0) {
      return;
    }
    uVar2 = uVar2 - 1;
    auVar34._8_4_ = (int)uVar2;
    auVar34._0_8_ = uVar2;
    auVar34._12_4_ = (int)(uVar2 >> 0x20);
    auVar9._0_8_ = uVar2 >> 3;
    auVar9._8_8_ = auVar34._8_8_ >> 3;
    auVar9 = auVar9 ^ _DAT_0014c590;
    iVar8 = auVar9._0_4_;
    iVar11 = auVar9._4_4_;
    iVar12 = auVar9._8_4_;
    iVar13 = auVar9._12_4_;
    auVar15._0_4_ = -(uint)(iVar11 == 0);
    auVar15._4_4_ = -(uint)(iVar11 == 0);
    auVar15._8_4_ = -(uint)(iVar13 == 0);
    auVar15._12_4_ = -(uint)(iVar13 == 0);
    auVar27._0_4_ = -(uint)(iVar8 < -0x80000000);
    auVar27._4_4_ = -(uint)(iVar11 < 0);
    auVar27._8_4_ = -(uint)(iVar12 < -0x7fffffff);
    auVar27._12_4_ = -(uint)(iVar13 < 0);
    auVar30._4_4_ = auVar27._0_4_;
    auVar30._0_4_ = auVar27._0_4_;
    auVar30._8_4_ = auVar27._8_4_;
    auVar30._12_4_ = auVar27._8_4_;
    auVar34 = pshuflw(auVar30 & auVar15,auVar27 & _DAT_0014c5b0 | auVar30 & auVar15,0xe8);
    auVar19._8_4_ = 0xffffffff;
    auVar19._0_8_ = 0xffffffffffffffff;
    auVar19._12_4_ = 0xffffffff;
    auVar34 = packssdw(auVar34 ^ auVar19,auVar34 ^ auVar19);
    if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      bmp[uVar1 >> 3] = '\0';
    }
    auVar38._0_4_ = -(uint)(iVar8 < -0x80000000);
    auVar38._4_4_ = -(uint)(iVar8 < -0x80000000);
    auVar38._8_4_ = -(uint)(iVar12 < -0x7fffffff);
    auVar38._12_4_ = -(uint)(iVar12 < -0x7fffffff);
    auVar34 = packssdw(auVar15 & auVar38,auVar15 & auVar38);
    auVar34 = packssdw(auVar34 ^ auVar19,auVar34 ^ auVar19);
    auVar34 = packsswb(auVar34,auVar34);
    if ((auVar34._0_4_ >> 8 & 1) != 0) {
      bmp[uVar1 + 8 >> 3] = '\0';
    }
    auVar35._4_4_ = -(uint)(0 < iVar11);
    auVar35._12_4_ = -(uint)(0 < iVar13);
    auVar14._0_4_ = -(uint)(iVar11 == 0);
    auVar14._4_4_ = -(uint)(iVar11 == 0);
    auVar14._8_4_ = -(uint)(iVar13 == 0);
    auVar14._12_4_ = -(uint)(iVar13 == 0);
    auVar26._4_4_ = -(uint)(-0x7fffffff < iVar8);
    auVar26._0_4_ = -(uint)(-0x7fffffff < iVar8);
    auVar26._8_4_ = -(uint)(-0x7ffffffe < iVar12);
    auVar26._12_4_ = -(uint)(-0x7ffffffe < iVar12);
    auVar35._0_4_ = auVar35._4_4_;
    auVar35._8_4_ = auVar35._12_4_;
    auVar34 = auVar14 & auVar26 | auVar35;
    auVar34 = packssdw(auVar34,auVar34);
    auVar34 = packssdw(auVar34,auVar34);
    auVar34 = packsswb(auVar34,auVar34);
    if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
      bmp[uVar1 + 0x10 >> 3] = '\0';
    }
    auVar9 = pshufhw(auVar14,auVar14,0x84);
    auVar27 = pshufhw(auVar26,auVar26,0x84);
    auVar15 = pshufhw(auVar9,auVar35,0x84);
    auVar15 = auVar15 | auVar27 & auVar9;
    auVar9 = packssdw(auVar15,auVar15);
    auVar9 = packsswb(auVar9,auVar9);
    if ((auVar9._0_4_ >> 0x18 & 1) != 0) {
      bmp[uVar1 + 0x18 >> 3] = '\0';
    }
    auVar16._0_4_ = -(uint)(iVar11 == 0);
    auVar16._4_4_ = -(uint)(iVar11 == 0);
    auVar16._8_4_ = -(uint)(iVar13 == 0);
    auVar16._12_4_ = -(uint)(iVar13 == 0);
    auVar17._4_4_ = -(uint)(0 < iVar11);
    auVar17._12_4_ = -(uint)(0 < iVar13);
    auVar34 = pshuflw(auVar34,auVar16,0xe8);
    auVar28._4_4_ = -(uint)(-0x7ffffffd < iVar8);
    auVar28._0_4_ = -(uint)(-0x7ffffffd < iVar8);
    auVar28._8_4_ = -(uint)(-0x7ffffffc < iVar12);
    auVar28._12_4_ = -(uint)(-0x7ffffffc < iVar12);
    auVar15 = pshuflw(in_XMM6,auVar28,0xe8);
    auVar17._0_4_ = auVar17._4_4_;
    auVar17._8_4_ = auVar17._12_4_;
    auVar9 = pshuflw(auVar34,auVar17,0xe8);
    auVar9 = auVar9 | auVar15 & auVar34;
    auVar9 = packssdw(auVar9,auVar9);
    auVar9 = packsswb(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      bmp[uVar1 + 0x20 >> 3] = '\0';
    }
    auVar17 = auVar16 & auVar28 | auVar17;
    auVar9 = packssdw(auVar17,auVar17);
    auVar9 = packssdw(auVar9,auVar9);
    auVar9 = packsswb(auVar9,auVar9);
    if ((auVar9._4_2_ >> 8 & 1) != 0) {
      bmp[uVar1 + 0x28 >> 3] = '\0';
    }
    auVar36._4_4_ = -(uint)(0 < iVar11);
    auVar36._12_4_ = -(uint)(0 < iVar13);
    auVar18._0_4_ = -(uint)(iVar11 == 0);
    auVar18._4_4_ = -(uint)(iVar11 == 0);
    auVar18._8_4_ = -(uint)(iVar13 == 0);
    auVar18._12_4_ = -(uint)(iVar13 == 0);
    auVar29._4_4_ = -(uint)(-0x7ffffffb < iVar8);
    auVar29._0_4_ = -(uint)(-0x7ffffffb < iVar8);
    auVar29._8_4_ = -(uint)(-0x7ffffffa < iVar12);
    auVar29._12_4_ = -(uint)(-0x7ffffffa < iVar12);
    auVar36._0_4_ = auVar36._4_4_;
    auVar36._8_4_ = auVar36._12_4_;
    auVar9 = auVar18 & auVar29 | auVar36;
    auVar9 = packssdw(auVar9,auVar9);
    auVar9 = packssdw(auVar9,auVar9);
    auVar9 = packsswb(auVar9,auVar9);
    if ((auVar9 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      bmp[uVar1 + 0x30 >> 3] = '\0';
    }
    auVar27 = pshufhw(auVar18,auVar18,0x84);
    auVar30 = pshufhw(auVar29,auVar29,0x84);
    auVar19 = pshufhw(auVar27,auVar36,0x84);
    auVar19 = auVar19 | auVar30 & auVar27;
    auVar27 = packssdw(auVar19,auVar19);
    auVar27 = packsswb(auVar27,auVar27);
    if ((auVar27._6_2_ >> 8 & 1) != 0) {
      bmp[uVar1 + 0x38 >> 3] = '\0';
    }
    auVar20._0_4_ = -(uint)(iVar11 == 0);
    auVar20._4_4_ = -(uint)(iVar11 == 0);
    auVar20._8_4_ = -(uint)(iVar13 == 0);
    auVar20._12_4_ = -(uint)(iVar13 == 0);
    auVar21._4_4_ = -(uint)(0 < iVar11);
    auVar21._12_4_ = -(uint)(0 < iVar13);
    auVar9 = pshuflw(auVar9,auVar20,0xe8);
    auVar31._4_4_ = -(uint)(-0x7ffffff9 < iVar8);
    auVar31._0_4_ = -(uint)(-0x7ffffff9 < iVar8);
    auVar31._8_4_ = -(uint)(-0x7ffffff8 < iVar12);
    auVar31._12_4_ = -(uint)(-0x7ffffff8 < iVar12);
    auVar15 = pshuflw(auVar15 & auVar34,auVar31,0xe8);
    auVar21._0_4_ = auVar21._4_4_;
    auVar21._8_4_ = auVar21._12_4_;
    auVar34 = pshuflw(auVar9,auVar21,0xe8);
    auVar34 = auVar34 | auVar15 & auVar9;
    auVar34 = packssdw(auVar34,auVar34);
    auVar34 = packsswb(auVar34,auVar34);
    if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      bmp[uVar1 + 0x40 >> 3] = '\0';
    }
    auVar21 = auVar20 & auVar31 | auVar21;
    auVar34 = packssdw(auVar21,auVar21);
    auVar34 = packssdw(auVar34,auVar34);
    auVar34 = packsswb(auVar34,auVar34);
    if ((auVar34._8_2_ >> 8 & 1) != 0) {
      bmp[uVar1 + 0x48 >> 3] = '\0';
    }
    auVar37._4_4_ = -(uint)(0 < iVar11);
    auVar37._12_4_ = -(uint)(0 < iVar13);
    auVar22._0_4_ = -(uint)(iVar11 == 0);
    auVar22._4_4_ = -(uint)(iVar11 == 0);
    auVar22._8_4_ = -(uint)(iVar13 == 0);
    auVar22._12_4_ = -(uint)(iVar13 == 0);
    auVar32._4_4_ = -(uint)(-0x7ffffff7 < iVar8);
    auVar32._0_4_ = -(uint)(-0x7ffffff7 < iVar8);
    auVar32._8_4_ = -(uint)(-0x7ffffff6 < iVar12);
    auVar32._12_4_ = -(uint)(-0x7ffffff6 < iVar12);
    auVar37._0_4_ = auVar37._4_4_;
    auVar37._8_4_ = auVar37._12_4_;
    auVar34 = auVar22 & auVar32 | auVar37;
    auVar34 = packssdw(auVar34,auVar34);
    auVar34 = packssdw(auVar34,auVar34);
    auVar34 = packsswb(auVar34,auVar34);
    if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      bmp[uVar1 + 0x50 >> 3] = '\0';
    }
    auVar27 = pshufhw(auVar22,auVar22,0x84);
    auVar30 = pshufhw(auVar32,auVar32,0x84);
    auVar19 = pshufhw(auVar27,auVar37,0x84);
    auVar19 = auVar19 | auVar30 & auVar27;
    auVar27 = packssdw(auVar19,auVar19);
    auVar27 = packsswb(auVar27,auVar27);
    if ((auVar27._10_2_ >> 8 & 1) != 0) {
      bmp[uVar1 + 0x58 >> 3] = '\0';
    }
    auVar23._0_4_ = -(uint)(iVar11 == 0);
    auVar23._4_4_ = -(uint)(iVar11 == 0);
    auVar23._8_4_ = -(uint)(iVar13 == 0);
    auVar23._12_4_ = -(uint)(iVar13 == 0);
    auVar24._4_4_ = -(uint)(0 < iVar11);
    auVar24._12_4_ = -(uint)(0 < iVar13);
    auVar34 = pshuflw(auVar34,auVar23,0xe8);
    auVar33._4_4_ = -(uint)(-0x7ffffff5 < iVar8);
    auVar33._0_4_ = -(uint)(-0x7ffffff5 < iVar8);
    auVar33._8_4_ = -(uint)(-0x7ffffff4 < iVar12);
    auVar33._12_4_ = -(uint)(-0x7ffffff4 < iVar12);
    auVar15 = pshuflw(auVar15 & auVar9,auVar33,0xe8);
    auVar24._0_4_ = auVar24._4_4_;
    auVar24._8_4_ = auVar24._12_4_;
    auVar9 = pshuflw(auVar34,auVar24,0xe8);
    auVar9 = auVar9 | auVar15 & auVar34;
    auVar34 = packssdw(auVar9,auVar9);
    auVar34 = packsswb(auVar34,auVar34);
    if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      bmp[uVar1 + 0x60 >> 3] = '\0';
    }
    auVar24 = auVar23 & auVar33 | auVar24;
    auVar34 = packssdw(auVar24,auVar24);
    auVar34 = packssdw(auVar34,auVar34);
    auVar34 = packsswb(auVar34,auVar34);
    if ((auVar34._12_2_ >> 8 & 1) != 0) {
      bmp[uVar1 + 0x68 >> 3] = '\0';
    }
    auVar10._4_4_ = -(uint)(0 < iVar11);
    auVar10._12_4_ = -(uint)(0 < iVar13);
    auVar7._0_4_ = -(uint)(iVar11 == 0);
    auVar7._4_4_ = -(uint)(iVar11 == 0);
    auVar7._8_4_ = -(uint)(iVar13 == 0);
    auVar7._12_4_ = -(uint)(iVar13 == 0);
    auVar25._4_4_ = -(uint)(-0x7ffffff3 < iVar8);
    auVar25._0_4_ = -(uint)(-0x7ffffff3 < iVar8);
    auVar25._8_4_ = -(uint)(-0x7ffffff2 < iVar12);
    auVar25._12_4_ = -(uint)(-0x7ffffff2 < iVar12);
    auVar10._0_4_ = auVar10._4_4_;
    auVar10._8_4_ = auVar10._12_4_;
    auVar34 = auVar7 & auVar25 | auVar10;
    auVar34 = packssdw(auVar34,auVar34);
    auVar34 = packssdw(auVar34,auVar34);
    auVar34 = packsswb(auVar34,auVar34);
    if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      bmp[uVar1 + 0x70 >> 3] = '\0';
    }
    auVar34 = pshufhw(auVar7,auVar7,0x84);
    auVar15 = pshufhw(auVar25,auVar25,0x84);
    auVar9 = pshufhw(auVar34,auVar10,0x84);
    auVar9 = auVar9 | auVar15 & auVar34;
    auVar34 = packssdw(auVar9,auVar9);
    auVar34 = packsswb(auVar34,auVar34);
    if ((auVar34._14_2_ >> 8 & 1) == 0) {
      return;
    }
    uVar1 = uVar1 + 0x78;
  }
  bmp[uVar1 >> 3] = '\0';
  return;
}

Assistant:

void sb_bmp_clear(uint8_t *bmp, bid_t bid, uint64_t len)
{
    _sb_bmp_update(bmp, bid, len, 0);
}